

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn.c
# Opt level: O2

int cmn_free(cmn_t *cmn)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (cmn != (cmn_t *)0x0) {
    iVar1 = cmn->refcount;
    iVar2 = iVar1 + -1;
    cmn->refcount = iVar2;
    if (iVar1 < 2) {
      if (cmn->cmn_var != (mfcc_t *)0x0) {
        ckd_free(cmn->cmn_var);
      }
      if (cmn->cmn_mean != (mfcc_t *)0x0) {
        ckd_free(cmn->cmn_mean);
      }
      if (cmn->sum != (mfcc_t *)0x0) {
        ckd_free(cmn->sum);
      }
      if (cmn->repr != (char *)0x0) {
        ckd_free(cmn->repr);
      }
      ckd_free(cmn);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
cmn_free(cmn_t * cmn)
{
    if (cmn == NULL)
        return 0;
    if (--cmn->refcount > 0)
        return cmn->refcount;
    if (cmn->cmn_var)
        ckd_free(cmn->cmn_var);
    if (cmn->cmn_mean)
        ckd_free(cmn->cmn_mean);
    if (cmn->sum)
        ckd_free(cmn->sum);
    if (cmn->repr)
        ckd_free(cmn->repr);
    ckd_free(cmn);
    return 0;
}